

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O2

void __thiscall Secp256K1::Secp256K1(Secp256K1 *this,string *privateKey)

{
  pointer pcVar1;
  bool bVar2;
  secp256k1_context *psVar3;
  Secp256K1Exception *this_00;
  char *error;
  string priv;
  
  psVar3 = secp256k1_context_create(0x301);
  this->ctx = psVar3;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  base16Decode(&priv,privateKey);
  pcVar1 = (privateKey->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->privKey,pcVar1,
             pcVar1 + privateKey->_M_string_length);
  bVar2 = verifyKey(this);
  if (bVar2) {
    bVar2 = createPublicKey(this,false);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&priv);
      return;
    }
    error = "Unable to create publick key";
  }
  else {
    error = "Unable to create and verify key:  ";
  }
  this_00 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
  Secp256K1Exception::Secp256K1Exception(this_00,error);
  __cxa_throw(this_00,&Secp256K1Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Secp256K1::Secp256K1(const std::string& privateKey)
    : ctx(secp256k1_context_create(SECP256K1_CONTEXT_SIGN | SECP256K1_CONTEXT_VERIFY))
{
    auto priv = Secp256K1::base16Decode(privateKey);

    privKey.assign(privateKey.begin(), privateKey.end());
    //verify priv key
    if (!verifyKey()) {
        throw Secp256K1Exception("Unable to create and verify key:  ");
    }

//    std::cout << privKey.data();

    if (!createPublicKey()) {
        throw Secp256K1Exception("Unable to create publick key");
    }
}